

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong_conflict
helper_addsc_mipsel(target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict4 *env)

{
  (env->active_tc).DSPControl =
       (int)((ulong)rt + (ulong)rs >> 0x20) << 0xd | (env->active_tc).DSPControl & 0xffffdfff;
  return (target_ulong_conflict)((ulong)rt + (ulong)rs);
}

Assistant:

target_ulong helper_addsc(target_ulong rs, target_ulong rt, CPUMIPSState *env)
{
    uint64_t temp, tempRs, tempRt;
    bool flag;

    tempRs = (uint64_t)rs & MIPSDSP_LLO;
    tempRt = (uint64_t)rt & MIPSDSP_LLO;

    temp = tempRs + tempRt;
    flag = (temp & 0x0100000000ull) >> 32;
    set_DSPControl_carryflag(flag, env);

    return (target_long)(int32_t)(temp & MIPSDSP_LLO);
}